

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::CheckOpcode2(TypeChecker *this,Opcode opcode)

{
  Result RVar1;
  Opcode local_5c;
  char *local_58;
  Type local_48;
  Type local_44;
  Type local_40;
  
  local_5c.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_5c);
  Opcode::GetInfo(&local_5c);
  Opcode::GetInfo(&local_5c);
  RVar1 = PopAndCheck2Types(this,local_44,local_40,local_58);
  Opcode::GetInfo(&local_5c);
  PushType(this,local_48);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode2(Opcode opcode) {
  Result result = PopAndCheck2Types(opcode.GetParamType1(),
                                    opcode.GetParamType2(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}